

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O3

bool DerBase::DecodeSet<UTF8String>
               (uchar *pIn,size_t cbIn,size_t *cbUsed,
               vector<UTF8String,_std::allocator<UTF8String>_> *out)

{
  bool bVar1;
  size_t local_20;
  size_t cbPrefix;
  size_t cbSize;
  
  local_20 = 0;
  cbPrefix = 0;
  bVar1 = DecodeSetOrSequenceOf<UTF8String>(ConstructedSet,pIn,cbIn,&local_20,&cbPrefix,out);
  if (bVar1) {
    *cbUsed = cbPrefix + local_20;
  }
  return bVar1;
}

Assistant:

static bool DecodeSet(const unsigned char* pIn, size_t cbIn, size_t& cbUsed, std::vector<T>& out)
	{
		size_t cbPrefix = 0;
		size_t cbSize = 0;
		bool ret = DecodeSetOrSequenceOf(DerType::ConstructedSet, pIn, cbIn, cbPrefix, cbSize, out);

		if (ret)
			cbUsed = cbPrefix + cbSize;

		return ret;
	}